

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O2

void __thiscall CfgNode::BlockData::addCall(BlockData *this,CFG *cfg,unsigned_long_long count)

{
  _Base_ptr *pp_Var1;
  iterator iVar2;
  mapped_type pCVar3;
  mapped_type *ppCVar4;
  Addr addr;
  
  addr = cfg->m_addr;
  iVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_CfgCall_*>,_std::_Select1st<std::pair<const_unsigned_long,_CfgCall_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgCall_*>_>_>
          ::find(&(this->m_calls)._M_t,&addr);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->m_calls)._M_t._M_impl.super__Rb_tree_header) {
    pCVar3 = (mapped_type)operator_new(0x18);
    pCVar3->_vptr_CfgCall = (_func_int **)&PTR__CfgCall_001298d8;
    pCVar3->m_called = cfg;
    pCVar3->m_count = count;
    ppCVar4 = std::
              map<unsigned_long,_CfgCall_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgCall_*>_>_>
              ::operator[](&this->m_calls,&addr);
    *ppCVar4 = pCVar3;
  }
  else {
    pp_Var1 = &(iVar2._M_node[1]._M_parent)->_M_left;
    *pp_Var1 = (_Base_ptr)((long)&(*pp_Var1)->_M_color + count);
  }
  return;
}

Assistant:

void CfgNode::BlockData::addCall(CFG* cfg, unsigned long long count) {
	Addr addr = cfg->addr();
	std::map<Addr, CfgCall*>::const_iterator it = m_calls.find(addr);
	if (it != m_calls.end()) {
		CfgCall* cfgCall = it->second;
		cfgCall->updateCount(count);
	} else {
		CfgCall* cfgCall = new CfgCall(cfg, count);
		m_calls[addr] = cfgCall;
	}
}